

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void update_sourceview_position(void)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Fl_Text_Buffer *pFVar4;
  int line_1;
  int line;
  int pos1;
  int pos0;
  
  if ((((sourceview_panel != (Fl_Double_Window *)0x0) &&
       (uVar2 = Fl_Widget::visible((Fl_Widget *)sourceview_panel), uVar2 != 0)) &&
      (cVar1 = Fl_Button::value(&sv_autoposition->super_Fl_Button), cVar1 != '\0')) &&
     (((sourceview_panel != (Fl_Double_Window *)0x0 &&
       (uVar2 = Fl_Widget::visible((Fl_Widget *)sourceview_panel), uVar2 != 0)) &&
      (Fl_Type::current != (Fl_Type *)0x0)))) {
    iVar3 = Fl_Widget::visible_r((Fl_Widget *)sv_source);
    if (iVar3 != 0) {
      iVar3 = Fl_Type::current->code_position;
      if (-1 < iVar3) {
        line_1 = Fl_Type::current->code_position_end;
        if (Fl_Type::current->code_position_end < iVar3) {
          line_1 = iVar3;
        }
        pFVar4 = Fl_Text_Display::buffer((Fl_Text_Display *)sv_source);
        Fl_Text_Buffer::highlight(pFVar4,iVar3,line_1);
        pFVar4 = Fl_Text_Display::buffer((Fl_Text_Display *)sv_source);
        iVar3 = Fl_Text_Buffer::count_lines(pFVar4,0,iVar3);
        Fl_Text_Display::scroll((Fl_Text_Display *)sv_source,iVar3,0);
      }
    }
    iVar3 = Fl_Widget::visible_r((Fl_Widget *)sv_header);
    if (iVar3 != 0) {
      iVar3 = Fl_Type::current->header_position;
      if (-1 < iVar3) {
        line_1 = Fl_Type::current->header_position_end;
        if (Fl_Type::current->header_position_end < iVar3) {
          line_1 = iVar3;
        }
        pFVar4 = Fl_Text_Display::buffer((Fl_Text_Display *)sv_header);
        Fl_Text_Buffer::highlight(pFVar4,iVar3,line_1);
        pFVar4 = Fl_Text_Display::buffer((Fl_Text_Display *)sv_header);
        iVar3 = Fl_Text_Buffer::count_lines(pFVar4,0,iVar3);
        Fl_Text_Display::scroll((Fl_Text_Display *)sv_header,iVar3,0);
      }
    }
  }
  return;
}

Assistant:

void update_sourceview_position()
{
  if (!sourceview_panel || !sourceview_panel->visible())
    return;
  if (sv_autoposition->value()==0)
    return;
  if (sourceview_panel && sourceview_panel->visible() && Fl_Type::current) {
    int pos0, pos1;
    if (sv_source->visible_r()) {
      pos0 = Fl_Type::current->code_position;
      pos1 = Fl_Type::current->code_position_end;
      if (pos0>=0) {
        if (pos1<pos0)
          pos1 = pos0;
        sv_source->buffer()->highlight(pos0, pos1);
        int line = sv_source->buffer()->count_lines(0, pos0);
        sv_source->scroll(line, 0);
      }
    }
    if (sv_header->visible_r()) {
      pos0 = Fl_Type::current->header_position;
      pos1 = Fl_Type::current->header_position_end;
      if (pos0>=0) {
        if (pos1<pos0)
          pos1 = pos0;
        sv_header->buffer()->highlight(pos0, pos1);
        int line = sv_header->buffer()->count_lines(0, pos0);
        sv_header->scroll(line, 0);
      }
    }
  }
}